

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void handle_simd_shift_intfp_conv
               (DisasContext_conflict1 *s,_Bool is_scalar,_Bool is_q,_Bool is_u,int immh,int immb,
               int opcode,int rn,int rd)

{
  int size;
  uint elements;
  
  if ((immh & 8U) == 0) {
    size = 2;
    if ((immh & 4U) == 0) {
      if ((immh & 2U) == 0) {
        if (immh != 1) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                     ,0x222d,"immh == 1");
        }
      }
      else {
        size = 1;
        if ((s->isar->id_aa64pfr0 & 0xf0000) == 0x10000) goto LAB_006b7139;
      }
LAB_006b71d6:
      unallocated_encoding_aarch64(s);
      return;
    }
  }
  else {
    size = 3;
    if (!is_scalar && !is_q) goto LAB_006b71d6;
  }
LAB_006b7139:
  elements = 1;
  if (!is_scalar) {
    elements = (uint)(8 << (is_q & 0x1fU)) >> (sbyte)size;
  }
  if (s->fp_access_checked != true) {
    s->fp_access_checked = true;
    if (s->fp_excp_el != 0) {
      gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
      return;
    }
    handle_simd_intfp_conv
              (s,rn,opcode,elements,(uint)!is_u,(0x10 << (sbyte)size) - (immh << 3 | immb),size);
    return;
  }
  __assert_fail("!s->fp_access_checked",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                ,0x487,"_Bool fp_access_check(DisasContext *)");
}

Assistant:

static void handle_simd_shift_intfp_conv(DisasContext *s, bool is_scalar,
                                         bool is_q, bool is_u,
                                         int immh, int immb, int opcode,
                                         int rn, int rd)
{
    int size, elements, fracbits;
    int immhb = immh << 3 | immb;

    if (immh & 8) {
        size = MO_64;
        if (!is_scalar && !is_q) {
            unallocated_encoding(s);
            return;
        }
    } else if (immh & 4) {
        size = MO_32;
    } else if (immh & 2) {
        size = MO_16;
        if (!dc_isar_feature(aa64_fp16, s)) {
            unallocated_encoding(s);
            return;
        }
    } else {
        /* immh == 0 would be a failure of the decode logic */
        g_assert(immh == 1);
        unallocated_encoding(s);
        return;
    }

    if (is_scalar) {
        elements = 1;
    } else {
        elements = (8 << is_q) >> size;
    }
    fracbits = (16 << size) - immhb;

    if (!fp_access_check(s)) {
        return;
    }

    handle_simd_intfp_conv(s, rd, rn, elements, !is_u, fracbits, size);
}